

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::cpp::EscapeTrigraphs(string *to_escape)

{
  undefined8 in_RSI;
  string *in_RDI;
  string *newsub;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  undefined1 local_31 [49];
  
  newsub = (string *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"?",(allocator *)newsub);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff98,"\\?",(allocator *)&stack0xffffffffffffff97);
  StringReplace(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,newsub,
                SUB81((ulong)in_RSI >> 0x38,0));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  return in_RDI;
}

Assistant:

std::string EscapeTrigraphs(const std::string& to_escape) {
  return StringReplace(to_escape, "?", "\\?", true);
}